

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isHierarchyInstantiation(Parser *this,bool requireName)

{
  bool bVar1;
  byte in_SIL;
  undefined8 in_RDI;
  Token TVar2;
  uint32_t index;
  uint32_t offset;
  ParserBase *this_00;
  undefined1 in_stack_ffffffffffffff88 [16];
  Parser *this_01;
  undefined1 in_stack_ffffffffffffff98 [16];
  Parser *in_stack_ffffffffffffffa8;
  TokenKind local_48;
  TokenKind local_38;
  TokenKind local_28;
  bool local_1;
  
  offset = (uint32_t)((ulong)in_RDI >> 0x20);
  TVar2 = ParserBase::peek(in_stack_ffffffffffffff88._0_8_,offset);
  local_28 = TVar2.kind;
  if (local_28 != Identifier) {
    return false;
  }
  TVar2 = ParserBase::peek(in_stack_ffffffffffffff88._0_8_,offset);
  this_01 = in_stack_ffffffffffffff98._0_8_;
  local_38 = TVar2.kind;
  if (local_38 == Hash) {
    TVar2 = ParserBase::peek(in_stack_ffffffffffffff88._0_8_,offset);
    this_01 = in_stack_ffffffffffffff98._0_8_;
    local_48 = TVar2.kind;
    if (local_48 != OpenParenthesis) {
      return false;
    }
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                      (in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98._8_8_,
                       in_stack_ffffffffffffff98._6_2_,in_stack_ffffffffffffff98._4_2_);
    if (!bVar1) {
      return false;
    }
  }
  TVar2 = ParserBase::peek(in_stack_ffffffffffffff88._0_8_,offset);
  this_00 = in_stack_ffffffffffffff88._0_8_;
  if (TVar2.kind == Identifier) {
    bVar1 = scanDimensionList(this_01,in_stack_ffffffffffffff88._8_8_);
    if (!bVar1) {
      return false;
    }
  }
  else if ((in_SIL & 1) != 0) {
    return false;
  }
  TVar2 = ParserBase::peek(this_00,offset);
  if (TVar2.kind == OpenParenthesis) {
    TVar2 = ParserBase::peek(this_00,offset);
    bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(TVar2.kind);
    local_1 = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Parser::isHierarchyInstantiation(bool requireName) {
    uint32_t index = 0;
    if (peek(index++).kind != TokenKind::Identifier)
        return false;

    // skip over std::optional parameter value assignment
    if (peek(index).kind == TokenKind::Hash) {
        if (peek(++index).kind != TokenKind::OpenParenthesis)
            return false;

        index++;
        if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                       TokenKind::CloseParenthesis)) {
            return false;
        }
    }

    if (peek(index).kind == TokenKind::Identifier) {
        index++;
        if (!scanDimensionList(index))
            return false;
    }
    else if (requireName) {
        return false;
    }

    // A parenthesis here indicates a start of a hierarchical instantiation,
    // unless there's a drive strength token immediately after it.
    if (peek(index++).kind != TokenKind::OpenParenthesis)
        return false;

    return !isDriveStrength(peek(index).kind);
}